

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

void cmFortranParser_RuleElif(cmFortranParser *parser)

{
  bool bVar1;
  reference pvVar2;
  cmFortranParser *parser_local;
  
  bVar1 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::empty(&parser->SkipToEnd);
  if (!bVar1) {
    pvVar2 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::top(&parser->SkipToEnd);
    if (((*pvVar2 & 1U) != 0) && (parser->InPPFalseBranch == 0)) {
      parser->InPPFalseBranch = 1;
    }
  }
  return;
}

Assistant:

void cmFortranParser_RuleElif(cmFortranParser* parser)
{
  /* Note: There are parser limitations.  See the note at
   * cmFortranParser_RuleIf(..)
   */

  // Always taken unless an #ifdef or #ifndef-branch has been taken
  // already.  If the second condition isn't meet already
  // (parser->InPPFalseBranch == 0) correct it.
  if (!parser->SkipToEnd.empty() && parser->SkipToEnd.top() &&
      !parser->InPPFalseBranch) {
    parser->InPPFalseBranch = 1;
  }
}